

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstracttestlogger.cpp
# Opt level: O0

void QTestPrivate::generateTestIdentifier(QTestCharBuffer *identifier,int parts)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  uint in_ESI;
  QTestCharBuffer *in_RDI;
  bool bVar5;
  char *tagFiller;
  char *globalDataTag;
  char *dataTag;
  char *testFuctionEnd;
  char *testFuctionStart;
  char *objectFunctionFiller;
  char *testFunction;
  char *testObject;
  char *local_88;
  char *local_80;
  char *local_70;
  char *local_68;
  char *local_60;
  
  if ((in_ESI & 1) == 0) {
    local_60 = "";
  }
  else {
    local_60 = QTestResult::currentTestObjectName();
  }
  if ((in_ESI & 2) == 0) {
    local_70 = "";
  }
  else {
    pcVar1 = QTestResult::currentTestFunction();
    if (pcVar1 == (char *)0x0) {
      local_68 = "UnknownTestFunc";
    }
    else {
      local_68 = QTestResult::currentTestFunction();
    }
    local_70 = local_68;
  }
  pcVar1 = "";
  if ((in_ESI & 1) != 0 && (in_ESI & 6) != 0) {
    pcVar1 = "::";
  }
  pcVar2 = "";
  if ((in_ESI & 2) != 0) {
    pcVar2 = "(";
  }
  pcVar3 = "";
  if ((in_ESI & 2) != 0) {
    pcVar3 = ")";
  }
  if (((in_ESI & 4) == 0) || (pcVar4 = QTestResult::currentDataTag(), pcVar4 == (char *)0x0)) {
    local_80 = "";
  }
  else {
    local_80 = QTestResult::currentDataTag();
  }
  if (((in_ESI & 4) == 0) || (pcVar4 = QTestResult::currentGlobalDataTag(), pcVar4 == (char *)0x0))
  {
    local_88 = "";
  }
  else {
    local_88 = QTestResult::currentGlobalDataTag();
  }
  bVar5 = false;
  if (*local_80 != '\0') {
    bVar5 = *local_88 != '\0';
  }
  pcVar4 = "";
  if (bVar5) {
    pcVar4 = ":";
  }
  QTest::qt_asprintf(in_RDI,"%s%s%s%s%s%s%s%s",local_60,pcVar1,local_70,pcVar2,local_88,pcVar4,
                     local_80,pcVar3);
  return;
}

Assistant:

void generateTestIdentifier(QTestCharBuffer *identifier, int parts)
{
    const char *testObject = parts & TestObject ? QTestResult::currentTestObjectName() : "";
    const char *testFunction = parts & TestFunction ? (QTestResult::currentTestFunction() ? QTestResult::currentTestFunction() : "UnknownTestFunc") : "";
    const char *objectFunctionFiller = parts & TestObject && parts & (TestFunction | TestDataTag) ? "::" : "";
    const char *testFuctionStart = parts & TestFunction ? "(" : "";
    const char *testFuctionEnd = parts & TestFunction ? ")" : "";

    const char *dataTag = (parts & TestDataTag) && QTestResult::currentDataTag() ? QTestResult::currentDataTag() : "";
    const char *globalDataTag = (parts & TestDataTag) && QTestResult::currentGlobalDataTag() ? QTestResult::currentGlobalDataTag() : "";
    const char *tagFiller = (dataTag[0] && globalDataTag[0]) ? ":" : "";

    QTest::qt_asprintf(identifier, "%s%s%s%s%s%s%s%s",
        testObject, objectFunctionFiller, testFunction, testFuctionStart,
        globalDataTag, tagFiller, dataTag, testFuctionEnd);
}